

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeForwardObj2(Of_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *pCutSet;
  int *pCut_00;
  int *pList;
  int *pCutMin;
  int *pCut;
  int k;
  int AreaMin;
  int Area;
  int AreaAft;
  int AreaBef;
  int Required;
  int Delay;
  int iObj_local;
  Of_Man_t *p_local;
  
  iVar1 = Of_ObjRequired(p,iObj);
  Area = 0;
  AreaMin = 0;
  pCut._4_4_ = 1000000000;
  pList = (int *)0x0;
  pCutSet = Of_ObjCutSet(p,iObj);
  iVar2 = Of_ObjRefNum(p,iObj);
  if (iVar2 != 0) {
    pCut_00 = Of_ObjCutBestP(p,iObj);
    Area = Of_CutDeref_rec(p,pCut_00);
  }
  pCut._0_4_ = 0;
  pCutMin = pCutSet + 1;
  while ((int)pCut < *pCutSet) {
    iVar2 = Of_ManComputeForwardCut(p,iObj,pCutMin);
    if ((iVar2 <= iVar1) && (iVar2 = Of_CutAreaDerefed2(p,pCutMin), iVar2 < pCut._4_4_)) {
      pList = pCutMin;
      pCut._4_4_ = iVar2;
    }
    pCut._0_4_ = (int)pCut + 1;
    iVar2 = Of_CutSize(pCutMin);
    pCutMin = pCutMin + (iVar2 + 4);
  }
  if (pList == (int *)0x0) {
    __assert_fail("pCutMin != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0x45c,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
  }
  Of_ObjSetCutBestP(p,pCutSet,iObj,pList);
  iVar2 = Of_ObjRefNum(p,iObj);
  if (iVar2 != 0) {
    AreaMin = Of_CutRef_rec(p,pList);
  }
  if (Area < AreaMin) {
    __assert_fail("AreaAft <= AreaBef",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0x460,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
  }
  iVar2 = Of_CutDelay1(pList);
  if (iVar1 < iVar2) {
    __assert_fail("Delay <= Required",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0x462,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
  }
  Of_ObjSetDelay1(p,iObj,iVar2);
  return;
}

Assistant:

static inline void Of_ManComputeForwardObj2( Of_Man_t * p, int iObj )
{
    int Delay, Required = Of_ObjRequired(p, iObj);
    int AreaBef = 0, AreaAft = 0, Area, AreaMin = ABC_INFINITY;
    int k, * pCut, * pCutMin = NULL, * pList = Of_ObjCutSet(p, iObj);
    if ( Of_ObjRefNum(p, iObj) )
        AreaBef = Of_CutDeref_rec( p, Of_ObjCutBestP(p, iObj) );        
    Of_SetForEachCut( pList, pCut, k )
    {
        Delay = Of_ManComputeForwardCut(p, iObj, pCut);
        if ( Delay > Required )
            continue;
        Area = Of_CutAreaDerefed2( p, pCut );
        if ( AreaMin > Area )
        {
            AreaMin = Area;
            pCutMin = pCut;
        }
    }
    assert( pCutMin != NULL );
    Of_ObjSetCutBestP( p, pList, iObj, pCutMin );
    if ( Of_ObjRefNum(p, iObj) )
        AreaAft = Of_CutRef_rec( p, pCutMin );
    assert( AreaAft <= AreaBef );
    Delay = Of_CutDelay1(pCutMin);
    assert( Delay <= Required );
    Of_ObjSetDelay1( p, iObj, Delay );
}